

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcEvaporativeCoolerType::~IfcEvaporativeCoolerType
          (IfcEvaporativeCoolerType *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  long *plVar5;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = pvVar2;
  *(void **)((long)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType
                    .super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x3f];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x40];
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x42];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148
       = vtt[0x43];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x180 = vtt[0x44];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x190 = vtt[0x45];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.field_0x1a0 = vtt[0x46];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             field_0x1b0 = vtt[0x47];
  puVar3 = *(undefined1 **)&(this->super_IfcEnergyConversionDeviceType).field_0x1c0;
  if (puVar3 != &this->field_0x1d0) {
    operator_delete(puVar3,*(long *)&this->field_0x1d0 + 1);
  }
  pvVar2 = vtt[4];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = pvVar2;
  *(void **)((long)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType
                    .super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x1d];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x1e];
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1f];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x20];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148
       = vtt[0x21];
  puVar4 = *(undefined1 **)
            &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x158;
  puVar3 = &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
            super_IfcDistributionElementType.super_IfcElementType.field_0x168;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  pvVar2 = vtt[5];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = pvVar2;
  *(void **)((long)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType
                    .super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x17];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x18];
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x19];
  *(void **)&(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x1a];
  plVar5 = (long *)(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
                   super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.Tag.
                   ptr._M_dataplus._M_p;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(this->super_IfcEnergyConversionDeviceType).
                      super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                      super_IfcElementType.super_IfcTypeProduct.Tag.ptr + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar5 != paVar1) {
    operator_delete(plVar5,paVar1->_M_allocated_capacity + 1);
  }
  pvVar2 = *(void **)&(this->super_IfcEnergyConversionDeviceType).
                      super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                      super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x100;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcEnergyConversionDeviceType).
                                     super_IfcDistributionFlowElementType.
                                     super_IfcDistributionElementType.super_IfcElementType.
                                     super_IfcTypeProduct.field_0x110 - (long)pvVar2);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,vtt + 6);
  return;
}

Assistant:

IfcEvaporativeCoolerType() : Object("IfcEvaporativeCoolerType") {}